

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O0

Element __thiscall wasm::RandomLattice::getBottom(RandomLattice *this)

{
  long in_RSI;
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_tools_wasm_fuzz_lattices_cpp:944:5),_const_std::variant<wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>_&>
  _Var1;
  Element EVar2;
  undefined1 local_19 [9];
  RandomLattice *this_local;
  
  this_local = this;
  std::
  unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
  ::operator*((unique_ptr<wasm::RandomLattice::LatticeImpl,_std::default_delete<wasm::RandomLattice::LatticeImpl>_>
               *)(in_RSI + 8));
  _Var1 = std::
          visit<wasm::RandomLattice::getBottom()const::__0,std::variant<wasm::RandomFullLattice,wasm::analysis::Flat<unsigned_int>,wasm::analysis::Lift<wasm::RandomLattice>,wasm::analysis::Array<wasm::RandomLattice,2ul>,wasm::analysis::Vector<wasm::RandomLattice>,wasm::analysis::Tuple<wasm::RandomLattice,wasm::RandomLattice>,wasm::analysis::SharedPath<wasm::RandomLattice>>const&>
                    ((anon_class_1_0_00000001 *)this,
                     (variant<wasm::RandomFullLattice,_wasm::analysis::Flat<unsigned_int>,_wasm::analysis::Lift<wasm::RandomLattice>,_wasm::analysis::Array<wasm::RandomLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomLattice>,_wasm::analysis::Tuple<wasm::RandomLattice,_wasm::RandomLattice>,_wasm::analysis::SharedPath<wasm::RandomLattice>_>
                      *)local_19);
  EVar2.super_unique_ptr<void,_void_(*)(void_*)>._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>.
  _M_t.super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Head_base<0UL,_void_*,_false>.
  _M_head_impl = _Var1.super_unique_ptr<void,_void_(*)(void_*)>._M_t.
                 super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                 super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                 super__Head_base<0UL,_void_*,_false>._M_head_impl;
  EVar2.super_unique_ptr<void,_void_(*)(void_*)>._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>.
  _M_t.super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(void_*),_false>)(_Head_base<1UL,_void_(*)(void_*),_false>)this;
  return (Element)EVar2.super_unique_ptr<void,_void_(*)(void_*)>._M_t.
                  super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>;
}

Assistant:

RandomLattice::Element RandomLattice::getBottom() const noexcept {
  return std::visit(
    [](const auto& l) -> Element { return ElementImpl{l.getBottom()}; },
    (const LatticeVariant&)*lattice);
}